

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall
HEkk::updateDualSteepestEdgeWeights
          (HEkk *this,HighsInt row_out,HighsInt variable_in,HVector *column,
          double new_pivotal_edge_weight,double Kai,double *dual_steepest_edge_array)

{
  HSimplexNla *this_00;
  bool bVar1;
  uint dim;
  pointer pdVar2;
  pointer pdVar3;
  bool bVar4;
  ulong uVar5;
  int iCol;
  long lVar6;
  double dVar7;
  double dVar8;
  HighsInt to_entry;
  HVector alt_pivotal_column;
  HVector alt_dual_steepest_edge_column;
  int local_1dc;
  double local_1d8;
  HSimplexNla *local_1d0;
  HighsSimplexAnalysis *local_1c8;
  double local_1c0;
  double local_1b8;
  pointer local_1b0;
  double local_1a8;
  double local_1a0;
  double *local_198;
  void *local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  void *pvStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  void *local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  void *pvStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  void *local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  void *pvStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  void *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  void *pvStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  void *local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  void *pvStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  void *local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  void *pvStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1c8 = &this->analysis_;
  local_1a8 = new_pivotal_edge_weight;
  local_1a0 = Kai;
  local_198 = dual_steepest_edge_array;
  HighsSimplexAnalysis::simplexTimerStart(local_1c8,0x4e,0);
  dim = (this->lp_).num_row_;
  local_1d8 = (double)CONCAT44(local_1d8._4_4_,column->count);
  local_1b0 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  pdVar2 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = &this->simplex_nla_;
  local_1b8 = HSimplexNla::variableScaleFactor(this_00,variable_in);
  local_1d0 = this_00;
  dVar7 = HSimplexNla::basicColScaleFactor(this_00,row_out);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  pvStack_c0 = (void *)0x0;
  local_d8 = (void *)0x0;
  uStack_d0 = 0;
  local_a0 = (void *)0x0;
  uStack_98 = 0;
  local_90 = 0;
  pvStack_88 = (void *)0x0;
  local_80 = 0;
  uStack_78 = 0;
  local_60 = (void *)0x0;
  uStack_58 = 0;
  local_50 = 0;
  pvStack_48 = (void *)0x0;
  local_40 = 0;
  uStack_38 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  pvStack_170 = (void *)0x0;
  local_188 = (void *)0x0;
  uStack_180 = 0;
  local_150 = (void *)0x0;
  uStack_148 = 0;
  local_140 = 0;
  pvStack_138 = (void *)0x0;
  local_130 = 0;
  uStack_128 = 0;
  local_110 = (void *)0x0;
  uStack_108 = 0;
  local_100 = 0;
  pvStack_f8 = (void *)0x0;
  local_f0 = 0;
  uStack_e8 = 0;
  uVar5 = (ulong)((long)(this->dual_edge_weight_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar5 < (int)dim) {
    printf("HEkk::updateDualSteepestEdgeWeights solve %d: dual_edge_weight_.size() = %d < %d\n",
           (ulong)(uint)this->debug_solve_call_num_,uVar5,(ulong)dim);
    fflush(_stdout);
  }
  bVar4 = HSimplexNla::sparseLoopStyle(local_1d0,local_1d8._0_4_,dim,&local_1dc);
  if (0 < local_1dc) {
    local_1c0 = 1.0 / dVar7;
    bVar1 = this->simplex_in_scaled_space_;
    lVar6 = 0;
    do {
      if (bVar4) {
        iCol = local_1b0[lVar6];
      }
      else {
        iCol = (int)lVar6;
      }
      dVar7 = pdVar2[iCol];
      local_1d8 = dVar7;
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        dVar8 = local_198[iCol];
        if (bVar1 == false) {
          dVar7 = HSimplexNla::basicColScaleFactor(local_1d0,iCol);
          dVar7 = (local_1d8 / dVar7) * local_1b8;
          dVar8 = dVar8 * local_1c0;
        }
        pdVar3 = (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar7 = (local_1a8 * dVar7 + dVar8 * local_1a0) * dVar7 + pdVar3[iCol];
        if (dVar7 <= 0.0001) {
          dVar7 = 0.0001;
        }
        pdVar3[iCol] = dVar7;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_1dc);
  }
  HighsSimplexAnalysis::simplexTimerStop(local_1c8,0x4e,0);
  if (pvStack_f8 != (void *)0x0) {
    operator_delete(pvStack_f8);
  }
  if (local_110 != (void *)0x0) {
    operator_delete(local_110);
  }
  if (pvStack_138 != (void *)0x0) {
    operator_delete(pvStack_138);
  }
  if (local_150 != (void *)0x0) {
    operator_delete(local_150);
  }
  if (pvStack_170 != (void *)0x0) {
    operator_delete(pvStack_170);
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188);
  }
  if (pvStack_48 != (void *)0x0) {
    operator_delete(pvStack_48);
  }
  if (local_60 != (void *)0x0) {
    operator_delete(local_60);
  }
  if (pvStack_88 != (void *)0x0) {
    operator_delete(pvStack_88);
  }
  if (local_a0 != (void *)0x0) {
    operator_delete(local_a0);
  }
  if (pvStack_c0 != (void *)0x0) {
    operator_delete(pvStack_c0);
  }
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8);
  }
  return;
}

Assistant:

void HEkk::updateDualSteepestEdgeWeights(
    const HighsInt row_out, const HighsInt variable_in, const HVector* column,
    const double new_pivotal_edge_weight, const double Kai,
    const double* dual_steepest_edge_array) {
  analysis_.simplexTimerStart(DseUpdateWeightClock);

  const HighsInt num_row = lp_.num_row_;
  const HighsInt column_count = column->count;
  const HighsInt* variable_index = column->index.data();
  const double* column_array = column->array.data();

  const double col_aq_scale = simplex_nla_.variableScaleFactor(variable_in);
  const double col_ap_scale = simplex_nla_.basicColScaleFactor(row_out);
  const double inv_col_ap_scale = 1.0 / col_ap_scale;

  const bool DSE_check = false;
  HVector alt_dual_steepest_edge_column;
  HVector alt_pivotal_column;
  if (DSE_check) {
    // Compute the DSE column otherwise to check
    alt_dual_steepest_edge_column.setup(num_row);
    alt_dual_steepest_edge_column.clear();
    alt_dual_steepest_edge_column.count = 1;
    alt_dual_steepest_edge_column.index[0] = row_out;
    alt_dual_steepest_edge_column.array[row_out] = 1;
    alt_dual_steepest_edge_column.packFlag = false;
    simplex_nla_.btranInScaledSpace(alt_dual_steepest_edge_column,
                                    info_.row_ep_density,
                                    analysis_.pointer_serial_factor_clocks);
    simplex_nla_.ftranInScaledSpace(alt_dual_steepest_edge_column,
                                    info_.row_DSE_density,
                                    analysis_.pointer_serial_factor_clocks);
    // Compute the pivotal column in the scaled space otherwise to check
    //
    // Need \bar{B}^{-1}(R.aq.cq) = \bar{B}^{-1}R.(cq.aq)
    //
    alt_pivotal_column.setup(num_row);
    alt_pivotal_column.clear();
    //
    // Determine cq, and apply it in forming RHS
    //
    lp_.a_matrix_.collectAj(alt_pivotal_column, variable_in, col_aq_scale);
    simplex_nla_.applyBasisMatrixRowScale(alt_pivotal_column);
    simplex_nla_.ftranInScaledSpace(alt_pivotal_column, info_.col_aq_density,
                                    analysis_.pointer_serial_factor_clocks);
    double max_dse_column_error = 0;
    double sum_dse_column_error = 0;
    HighsInt num_dse_column_error = 0;
    const double dse_column_value_tolerance = 1e-2;
    const double dse_column_error_tolerance = 1e-4;
    HighsInt DSE_array_count = 0;
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      const double dual_steepest_edge_array_value =
          dual_steepest_edge_array[iRow] * inv_col_ap_scale;
      if (dual_steepest_edge_array_value) DSE_array_count++;
      if (std::abs(dual_steepest_edge_array_value) >
              dse_column_value_tolerance ||
          std::abs(alt_dual_steepest_edge_column.array[iRow]) >
              dse_column_value_tolerance) {
        const double dse_column_error =
            std::abs(alt_dual_steepest_edge_column.array[iRow] -
                     dual_steepest_edge_array_value) /
            std::max(1.0, std::abs(dual_steepest_edge_array_value));
        sum_dse_column_error += dse_column_error;
        if (dse_column_error > dse_column_error_tolerance) {
          max_dse_column_error =
              std::max(dse_column_error, max_dse_column_error);
          num_dse_column_error++;
        }
      }
    }
    if (max_dse_column_error > dse_column_error_tolerance) {
      printf(
          "HEkk::updateDualSteepestEdgeWeights: Iter %2d has num / max / sum = "
          "%d / %g / %g DSE column errors exceeding = %g\n",
          (int)iteration_count_, (int)num_dse_column_error,
          max_dse_column_error, sum_dse_column_error,
          dse_column_error_tolerance);
      printf("DSE column count alt = %d; og = %d)\n",
             (int)alt_dual_steepest_edge_column.count, (int)DSE_array_count);
      for (HighsInt iRow = 0; iRow < num_row; iRow++) {
        const double dual_steepest_edge_array_value =
            dual_steepest_edge_array[iRow] * inv_col_ap_scale;
        if (alt_dual_steepest_edge_column.array[iRow] != 0 &&
            dual_steepest_edge_array_value != 0) {
          const double dse_column_error =
              std::abs(alt_dual_steepest_edge_column.array[iRow] -
                       dual_steepest_edge_array_value) /
              std::max(1.0, std::abs(dual_steepest_edge_array_value));
          if (dse_column_error > 1e-10)
            printf(
                "Row %4d: DSE column (alt = %11.4g; og = %11.4g) difference "
                "%10.4g\n",
                (int)iRow, alt_dual_steepest_edge_column.array[iRow],
                dual_steepest_edge_array_value, dse_column_error);
        }
      }
      fflush(stdout);
      assert(max_dse_column_error < dse_column_error_tolerance);
    }
  }

  if ((HighsInt)dual_edge_weight_.size() < num_row) {
    printf(
        "HEkk::updateDualSteepestEdgeWeights solve %d: "
        "dual_edge_weight_.size() = %d < %d\n",
        (int)debug_solve_call_num_, (int)dual_edge_weight_.size(),
        (int)num_row);
    fflush(stdout);
  }
  assert((HighsInt)dual_edge_weight_.size() >= num_row);
  HighsInt to_entry;
  const bool use_row_indices =
      simplex_nla_.sparseLoopStyle(column_count, num_row, to_entry);
  const bool convert_to_scaled_space = !simplex_in_scaled_space_;
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_row_indices ? variable_index[iEntry] : iEntry;
    double aa_iRow = column_array[iRow];
    if (!aa_iRow) continue;
    double dual_steepest_edge_array_value = dual_steepest_edge_array[iRow];
    if (convert_to_scaled_space) {
      double basic_col_scale = simplex_nla_.basicColScaleFactor(iRow);
      aa_iRow /= basic_col_scale;
      aa_iRow *= col_aq_scale;
      dual_steepest_edge_array_value *= inv_col_ap_scale;
    }
    if (DSE_check) {
      const double pivotal_column_error =
          std::abs(aa_iRow - alt_pivotal_column.array[iRow]);
      if (pivotal_column_error > 1e-4) {
        printf(
            "HEkk::updateDualSteepestEdgeWeights Row %2d of pivotal column has "
            "error %10.4g\n",
            (int)iRow, pivotal_column_error);
        fflush(stdout);
      }
      assert(pivotal_column_error < 1e-4);
    }
    dual_edge_weight_[iRow] += aa_iRow * (new_pivotal_edge_weight * aa_iRow +
                                          Kai * dual_steepest_edge_array_value);
    dual_edge_weight_[iRow] =
        std::max(kMinDualSteepestEdgeWeight, dual_edge_weight_[iRow]);
  }
  analysis_.simplexTimerStop(DseUpdateWeightClock);
}